

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_asn1.cc
# Opt level: O0

EC_GROUP * d2i_ECPKParameters(EC_GROUP **param_1,uchar **in,long len)

{
  uint8_t *puVar1;
  EC_GROUP *ret;
  CBS cbs;
  long len_local;
  uint8_t **inp_local;
  EC_GROUP **out_local;
  
  if (len < 0) {
    out_local = (EC_GROUP **)0x0;
  }
  else {
    cbs.len = len;
    CBS_init((CBS *)&ret,*in,len);
    out_local = (EC_GROUP **)EC_KEY_parse_parameters((CBS *)&ret);
    if ((EC_GROUP *)out_local == (EC_GROUP *)0x0) {
      out_local = (EC_GROUP **)0x0;
    }
    else {
      if (param_1 != (EC_GROUP **)0x0) {
        EC_GROUP_free(*param_1);
        *param_1 = (EC_GROUP *)out_local;
      }
      puVar1 = CBS_data((CBS *)&ret);
      *in = puVar1;
    }
  }
  return (EC_GROUP *)out_local;
}

Assistant:

EC_GROUP *d2i_ECPKParameters(EC_GROUP **out, const uint8_t **inp, long len) {
  if (len < 0) {
    return NULL;
  }

  CBS cbs;
  CBS_init(&cbs, *inp, (size_t)len);
  EC_GROUP *ret = EC_KEY_parse_parameters(&cbs);
  if (ret == NULL) {
    return NULL;
  }

  if (out != NULL) {
    EC_GROUP_free(*out);
    *out = ret;
  }
  *inp = CBS_data(&cbs);
  return ret;
}